

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::tessellation::anon_unknown_1::UserDefinedIOTest::createInstance
          (UserDefinedIOTest *this,Context *context)

{
  deInt32 *pdVar1;
  VertexIOArraySize VVar2;
  _func_int **pp_Var3;
  pointer pcVar4;
  pointer pSVar5;
  SharedPtrStateBase *pSVar6;
  SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *__cur;
  TestInstance *pTVar7;
  Context *pCVar8;
  pointer pSVar9;
  long lVar10;
  long *__n;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pTVar7 = (TestInstance *)operator_new(0x58);
  pp_Var3 = *(_func_int ***)&this->m_caseDef;
  VVar2 = (this->m_caseDef).vertexIOArraySize;
  pcVar4 = (this->m_caseDef).referenceImagePath._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,
             pcVar4 + (this->m_caseDef).referenceImagePath._M_string_length);
  pTVar7->m_context = context;
  pTVar7->_vptr_TestInstance = (_func_int **)&PTR__UserDefinedIOTestInstance_00d64bd0;
  pTVar7[1]._vptr_TestInstance = pp_Var3;
  *(VertexIOArraySize *)&pTVar7[1].m_context = VVar2;
  pTVar7[2]._vptr_TestInstance = (_func_int **)(pTVar7 + 3);
  __n = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7 + 2),local_50,local_48 + (long)local_50);
  lVar10 = (long)(this->m_tesInputs).
                 super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_tesInputs).
                 super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pTVar7[4]._vptr_TestInstance = (_func_int **)0x0;
  pTVar7[4].m_context = (Context *)0x0;
  pTVar7[5]._vptr_TestInstance = (_func_int **)0x0;
  pCVar8 = (Context *)
           std::
           _Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
           ::_M_allocate((_Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                          *)(lVar10 >> 4),(size_t)__n);
  pTVar7[4]._vptr_TestInstance = (_func_int **)pCVar8;
  pTVar7[4].m_context = pCVar8;
  pTVar7[5]._vptr_TestInstance = (_func_int **)(lVar10 + (long)pCVar8);
  pSVar5 = (this->m_tesInputs).
           super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar9 = (this->m_tesInputs).
                super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar9 != pSVar5; pSVar9 = pSVar9 + 1) {
    pCVar8->m_testCtx = (TestContext *)pSVar9->m_ptr;
    pSVar6 = pSVar9->m_state;
    pCVar8->m_platformInterface = (PlatformInterface *)pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((SharedPtrStateBase *)pCVar8->m_platformInterface)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pCVar8 = (Context *)&pCVar8->m_progCollection;
  }
  pTVar7[4].m_context = pCVar8;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return pTVar7;
}

Assistant:

TestInstance* UserDefinedIOTest::createInstance (Context& context) const
{
	return new UserDefinedIOTestInstance(context, m_caseDef, m_tesInputs);
}